

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlogging.cpp
# Opt level: O0

void __thiscall QMessageLogger::debug(QMessageLogger *this,CategoryFunction catFunc,char *msg,...)

{
  bool bVar1;
  QLoggingCategory *this_00;
  QMessageLogContext *in_RCX;
  code *in_RSI;
  __va_list_tag *in_RDI;
  QInternalMessageLogContext *in_R8;
  long in_FS_OFFSET;
  QLoggingCategory *cat;
  va_list ap;
  QInternalMessageLogContext ctxt;
  char *in_stack_fffffffffffffdb8;
  QMessageLogContext *in_stack_fffffffffffffdc0;
  undefined4 in_stack_fffffffffffffdc8;
  QtMsgType in_stack_fffffffffffffdcc;
  undefined1 local_148 [320];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QLoggingCategory *)(*in_RSI)();
  bVar1 = QLoggingCategory::isDebugEnabled((QLoggingCategory *)0x241759);
  if (bVar1) {
    memset(local_148,0xaa,0x140);
    QLoggingCategory::operator()(this_00);
    QInternalMessageLogContext::QInternalMessageLogContext
              (in_R8,in_RCX,
               (QLoggingCategory *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
    qt_message(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,in_RDI)
    ;
    QInternalMessageLogContext::~QInternalMessageLogContext((QInternalMessageLogContext *)0x241824);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMessageLogger::debug(QMessageLogger::CategoryFunction catFunc,
                           const char *msg, ...) const
{
    const QLoggingCategory &cat = (*catFunc)();
    if (!cat.isDebugEnabled())
        return;

    QInternalMessageLogContext ctxt(context, cat());

    va_list ap;
    va_start(ap, msg); // use variable arg list
    qt_message(QtDebugMsg, ctxt, msg, ap);
    va_end(ap);
}